

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_sort_api(void)

{
  int iVar1;
  secp256k1_pubkey *pks_ptr [2];
  secp256k1_pubkey pks [2];
  int ecount;
  int *in_stack_ffffffffffffff68;
  undefined1 *n_pubkeys;
  secp256k1_context *in_stack_ffffffffffffff70;
  secp256k1_pubkey **pubkeys;
  secp256k1_context *in_stack_ffffffffffffff78;
  secp256k1_pubkey *apsStack_48 [5];
  secp256k1_pubkey *in_stack_ffffffffffffffe0;
  
  set_counting_callbacks(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  n_pubkeys = &stack0xffffffffffffff78;
  pubkeys = apsStack_48;
  rand_pk(in_stack_ffffffffffffffe0);
  rand_pk(in_stack_ffffffffffffffe0);
  iVar1 = secp256k1_pubkey_sort(in_stack_ffffffffffffff78,pubkeys,(size_t)n_pubkeys);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2a5,"test condition failed: secp256k1_pubkey_sort(CTX, pks_ptr, 2) == 1");
    abort();
  }
  iVar1 = secp256k1_pubkey_sort(in_stack_ffffffffffffff78,pubkeys,(size_t)n_pubkeys);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x2a7,"test condition failed: ecount == 1");
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
          ,0x2a6,"test condition failed: secp256k1_pubkey_sort(CTX, NULL, 2) == 0");
  abort();
}

Assistant:

static void test_sort_api(void) {
    int ecount = 0;
    secp256k1_pubkey pks[2];
    const secp256k1_pubkey *pks_ptr[2];

    set_counting_callbacks(CTX, &ecount);

    pks_ptr[0] = &pks[0];
    pks_ptr[1] = &pks[1];

    rand_pk(&pks[0]);
    rand_pk(&pks[1]);

    CHECK(secp256k1_pubkey_sort(CTX, pks_ptr, 2) == 1);
    CHECK(secp256k1_pubkey_sort(CTX, NULL, 2) == 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_pubkey_sort(CTX, pks_ptr, 0) == 1);
    /* Test illegal public keys */
    memset(&pks[0], 0, sizeof(pks[0]));
    CHECK(secp256k1_pubkey_sort(CTX, pks_ptr, 2) == 1);
    CHECK(ecount == 2);
    memset(&pks[1], 0, sizeof(pks[1]));
    CHECK(secp256k1_pubkey_sort(CTX, pks_ptr, 2) == 1);
    CHECK(ecount > 2);

}